

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

Error __thiscall asmjit::Assembler::embedConstPool(Assembler *this,Label *label,ConstPool *pool)

{
  ulong n;
  bool bVar1;
  Error EVar2;
  uint8_t *dst;
  
  EVar2 = (this->super_CodeEmitter)._lastError;
  if (EVar2 == 0) {
    bVar1 = CodeEmitter::isLabelValid
                      (&this->super_CodeEmitter,
                       (label->super_Operand).super_Operand_.field_0._any.id);
    EVar2 = 0xc;
    if (bVar1) {
      EVar2 = (*(this->super_CodeEmitter)._vptr_CodeEmitter[10])
                        (this,1,(ulong)(uint)pool->_alignment);
      if (EVar2 == 0) {
        EVar2 = (*(this->super_CodeEmitter)._vptr_CodeEmitter[9])(this,label);
        if (EVar2 == 0) {
          dst = this->_bufferPtr;
          n = pool->_size;
          if ((ulong)((long)this->_bufferEnd - (long)dst) < n) {
            EVar2 = CodeHolder::growBuffer
                              ((this->super_CodeEmitter)._code,&this->_section->_buffer,n);
            if (EVar2 != 0) {
              EVar2 = CodeEmitter::setLastError(&this->super_CodeEmitter,EVar2,(char *)0x0);
              return EVar2;
            }
            dst = this->_bufferPtr;
          }
          ConstPool::fill(pool,dst);
          if (((this->super_CodeEmitter)._globalOptions & 4) != 0) {
            Logger::logBinary(((this->super_CodeEmitter)._code)->_logger,dst,n);
          }
          this->_bufferPtr = this->_bufferPtr + n;
          EVar2 = 0;
        }
      }
    }
  }
  return EVar2;
}

Assistant:

Error Assembler::embedConstPool(const Label& label, const ConstPool& pool) {
  if (_lastError) return _lastError;

  if (!isLabelValid(label))
    return DebugUtils::errored(kErrorInvalidLabel);

  ASMJIT_PROPAGATE(align(kAlignData, static_cast<uint32_t>(pool.getAlignment())));
  ASMJIT_PROPAGATE(bind(label));

  size_t size = pool.getSize();
  if (getRemainingSpace() < size) {
    Error err = _code->growBuffer(&_section->_buffer, size);
    if (ASMJIT_UNLIKELY(err)) return setLastError(err);
  }

  uint8_t* p = _bufferPtr;
  pool.fill(p);

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled)
    _code->_logger->logBinary(p, size);
#endif // !ASMJIT_DISABLE_LOGGING

  _bufferPtr += size;
  return kErrorOk;
}